

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nntree.cc
# Opt level: O3

void test_depth(void)

{
  bool bVar1;
  reference pTVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char *__end;
  long lVar5;
  int n;
  iterator *piVar6;
  QUtil *this;
  size_type sVar7;
  string first;
  QPDF q;
  QPDFObjectHandle n3;
  QPDFObjectHandle n2;
  QPDFNameTreeObjectHelper nh;
  QPDFObjectHandle limits;
  QPDFObjectHandle limits_2;
  QPDFObjectHandle n1;
  QPDFObjectHandle k2;
  QPDFObjectHandle k1;
  QPDFObjectHandle n0;
  QPDFObjectHandle items;
  QPDFObjectHandle root;
  QPDFObjectHandle k0;
  iterator local_220;
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [40];
  iterator local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  local_130;
  undefined1 local_100 [32];
  QUtil *local_e0;
  QUtil *local_d8;
  QUtil *local_d0;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  QPDFObjectHandle local_88;
  string local_78;
  long local_58;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  QPDF::QPDF((QPDF *)local_1d8);
  QPDF::emptyPDF((QPDF *)local_1d8);
  QPDF::getRoot((QPDF *)&local_78);
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Kids","");
  new_node((QPDF *)&local_a8,(string *)local_1d8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/NT","");
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_78,(string *)&local_220,&local_a8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/NT","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1b0,&local_78);
  local_178._vptr_iterator =
       (_func_int **)
       &local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a0 + 0x28),"/Kids","");
  QPDFObjectHandle::getKey(&local_50,(string *)local_1b0);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178._vptr_iterator !=
      &local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_178._vptr_iterator,
                    CONCAT71(local_178.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_178.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_e0 = (QUtil *)0x0;
  sVar7 = 0;
  do {
    local_220._vptr_iterator =
         (_func_int **)
         &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_78.field_2._M_allocated_capacity = sVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Kids","");
    new_node((QPDF *)local_100,(string *)local_1d8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
        &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_220._vptr_iterator,
                      CONCAT71(local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._1_7_,
                               local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_) + 1);
    }
    QPDFObjectHandle::appendItem(&local_50,(QPDFObjectHandle *)local_100);
    local_220._vptr_iterator =
         (_func_int **)
         &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Kids","");
    QPDFObjectHandle::getKey(&local_b8,(string *)local_100);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
        &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_220._vptr_iterator,
                      CONCAT71(local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._1_7_,
                               local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_) + 1);
    }
    local_d8 = local_e0;
    lVar5 = 0;
    do {
      local_220._vptr_iterator =
           (_func_int **)
           &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      local_78.field_2._8_8_ = lVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Kids","");
      new_node((QPDF *)local_1c0,(string *)local_1d8);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
          &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_220._vptr_iterator,
                        CONCAT71(local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._1_7_,
                                 local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._0_1_) + 1);
      }
      QPDFObjectHandle::appendItem(&local_b8,(QPDFObjectHandle *)local_1c0);
      local_220._vptr_iterator =
           (_func_int **)
           &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Kids","");
      QPDFObjectHandle::getKey(&local_c8,(string *)local_1c0);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
          &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_220._vptr_iterator,
                        CONCAT71(local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._1_7_,
                                 local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._0_1_) + 1);
      }
      local_d0 = local_d8;
      lVar5 = 0;
      do {
        local_220._vptr_iterator =
             (_func_int **)
             &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
        local_58 = lVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Names","");
        new_node((QPDF *)local_1d0,(string *)local_1d8);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
            &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_220._vptr_iterator,
                          CONCAT71(local_220.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._1_7_,
                                   local_220.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._0_1_) + 1);
        }
        QPDFObjectHandle::appendItem(&local_c8,(QPDFObjectHandle *)local_1d0);
        local_220._vptr_iterator =
             (_func_int **)
             &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Names","");
        QPDFObjectHandle::getKey(&local_88,(string *)local_1d0);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
            &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_220._vptr_iterator,
                          CONCAT71(local_220.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._1_7_,
                                   local_220.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._0_1_) + 1);
        }
        local_220._vptr_iterator =
             (_func_int **)
             &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
        uVar4 = 0;
        local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_1_ = 0;
        local_178._vptr_iterator =
             (_func_int **)
             &local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
        local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_1_ = 0;
        lVar5 = 0;
        this = local_d0;
        do {
          QUtil::int_to_string_abi_cxx11_((string *)local_1b0,this,6,(int)uVar4);
          QPDFObjectHandle::newString((QPDFObjectHandle *)&local_130,(string *)local_1b0);
          QPDFObjectHandle::appendItem(&local_88,(QPDFObjectHandle *)&local_130);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_130.first._M_string_length);
          }
          std::operator+(&local_130.first,"val ",(string *)local_1b0);
          QPDFObjectHandle::newString(&local_40,&local_130.first);
          QPDFObjectHandle::appendItem(&local_88,&local_40);
          if (local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.first._M_dataplus._M_p != &local_130.first.field_2) {
            operator_delete(local_130.first._M_dataplus._M_p,
                            local_130.first.field_2._M_allocated_capacity + 1);
          }
          piVar6 = (iterator *)(local_1a0 + 0x28);
          if (((int)lVar5 == 2) || (piVar6 = &local_220, (int)lVar5 == 0)) {
            std::__cxx11::string::_M_assign((string *)piVar6);
          }
          if ((element_type *)local_1b0._0_8_ != (element_type *)local_1a0) {
            operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
          }
          lVar5 = lVar5 + 1;
          this = this + 10;
        } while (lVar5 != 3);
        QPDFObjectHandle::newArray();
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Limits","");
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_1d0,(string *)local_1b0,(QPDFObjectHandle *)&local_130)
        ;
        if ((element_type *)local_1b0._0_8_ != (element_type *)local_1a0) {
          operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
        }
        QPDFObjectHandle::newString((QPDFObjectHandle *)local_1b0,(string *)&local_220);
        QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_130,(QPDFObjectHandle *)local_1b0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
        }
        QPDFObjectHandle::newString((QPDFObjectHandle *)local_1b0,(string *)(local_1a0 + 0x28));
        QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_130,(QPDFObjectHandle *)local_1b0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_130.first._M_string_length);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178._vptr_iterator !=
            &local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_178._vptr_iterator,
                          CONCAT71(local_178.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._1_7_,
                                   local_178.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._0_1_) + 1);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
            &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_220._vptr_iterator,
                          CONCAT71(local_220.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._1_7_,
                                   local_220.impl.
                                   super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._0_1_) + 1);
        }
        if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        lVar5 = local_58;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
        }
        lVar5 = lVar5 + 1;
        local_d0 = local_d0 + 0x1e;
      } while (lVar5 != 3);
      QPDFObjectHandle::newArray();
      local_220._vptr_iterator =
           (_func_int **)
           &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Limits","");
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_1c0,(string *)&local_220,
                 (QPDFObjectHandle *)(local_1a0 + 0x28));
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
          &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_220._vptr_iterator,
                        CONCAT71(local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._1_7_,
                                 local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._0_1_) + 1);
      }
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1d0,(int)&local_c8);
      local_220._vptr_iterator =
           (_func_int **)
           &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Limits","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_130,(string *)local_1d0);
      n = (int)&local_130;
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1b0,n);
      QPDFObjectHandle::appendItem
                ((QPDFObjectHandle *)(local_1a0 + 0x28),(QPDFObjectHandle *)local_1b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length)
        ;
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
          &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_220._vptr_iterator,
                        CONCAT71(local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._1_7_,
                                 local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._0_1_) + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1d0,(int)&local_c8);
      local_220._vptr_iterator =
           (_func_int **)
           &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Limits","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_130,(string *)local_1d0);
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1b0,n);
      QPDFObjectHandle::appendItem
                ((QPDFObjectHandle *)(local_1a0 + 0x28),(QPDFObjectHandle *)local_1b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length)
        ;
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
          &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_220._vptr_iterator,
                        CONCAT71(local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._1_7_,
                                 local_220.impl.
                                 super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._0_1_) + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      if (local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      uVar4 = local_78.field_2._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
      }
      lVar5 = uVar4 + 1;
      local_d8 = local_d8 + 0x5a;
    } while (lVar5 != 3);
    QPDFObjectHandle::newArray();
    local_220._vptr_iterator =
         (_func_int **)
         &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Limits","");
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_100,(string *)&local_220,
               (QPDFObjectHandle *)(local_1a0 + 0x28));
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
        &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_220._vptr_iterator,
                      CONCAT71(local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._1_7_,
                               local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_) + 1);
    }
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1c0,(int)&local_b8);
    local_220._vptr_iterator =
         (_func_int **)
         &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Limits","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_130,(string *)local_1c0);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1b0,n);
    QPDFObjectHandle::appendItem
              ((QPDFObjectHandle *)(local_1a0 + 0x28),(QPDFObjectHandle *)local_1b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
        &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_220._vptr_iterator,
                      CONCAT71(local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._1_7_,
                               local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_) + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
    }
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1c0,(int)&local_b8);
    local_220._vptr_iterator =
         (_func_int **)
         &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Limits","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_130,(string *)local_1c0);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1b0,n);
    QPDFObjectHandle::appendItem
              ((QPDFObjectHandle *)(local_1a0 + 0x28),(QPDFObjectHandle *)local_1b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.first._M_string_length);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
        &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_220._vptr_iterator,
                      CONCAT71(local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._1_7_,
                               local_220.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_) + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
    }
    if (local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    uVar4 = local_78.field_2._M_allocated_capacity;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    sVar7 = uVar4 + 1;
    local_e0 = local_e0 + 0x10e;
  } while (sVar7 != 3);
  local_98._M_allocated_capacity =
       (size_type)
       local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_98._8_8_ =
       local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
            ((QPDFNameTreeObjectHelper *)local_1b0,(QPDFObjectHandle *)&local_98,(QPDF *)local_1d8,
             true);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- forward ---",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  QPDFNameTreeObjectHelper::begin(&local_220,(QPDFNameTreeObjectHelper *)local_1b0);
  QPDFNameTreeObjectHelper::end
            ((iterator *)(local_1a0 + 0x28),(QPDFNameTreeObjectHelper *)local_1b0);
  while (bVar1 = QPDFNameTreeObjectHelper::iterator::operator==
                           (&local_220,(iterator *)(local_1a0 + 0x28)), !bVar1) {
    pTVar2 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_(&local_220);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::pair(&local_130,pTVar2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_130.first._M_dataplus._M_p,
                        local_130.first._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
    QPDFObjectHandle::unparse_abi_cxx11_((string *)local_100,&local_130.second);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_100._0_8_,local_100._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((Members *)local_100._0_8_ != (Members *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    if (local_130.second.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.second.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.first._M_dataplus._M_p != &local_130.first.field_2) {
      operator_delete(local_130.first._M_dataplus._M_p,
                      local_130.first.field_2._M_allocated_capacity + 1);
    }
    QPDFNameTreeObjectHelper::iterator::operator++(&local_220);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)(local_1a0 + 0x28));
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_220);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- backward ---",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  QPDFNameTreeObjectHelper::last(&local_220,(QPDFNameTreeObjectHelper *)local_1b0);
  while (bVar1 = QPDFNameTreeObjectHelper::iterator::valid(&local_220), bVar1) {
    pTVar2 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_(&local_220);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pTVar2->first)._M_dataplus._M_p,
                        (pTVar2->first)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
    pTVar2 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_(&local_220);
    QPDFObjectHandle::unparse_abi_cxx11_((string *)(local_1a0 + 0x28),&pTVar2->second);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_178._vptr_iterator,
                        (long)local_178.impl.
                              super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178._vptr_iterator !=
        &local_178.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_178._vptr_iterator,
                      CONCAT71(local_178.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._1_7_,
                               local_178.impl.
                               super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_) + 1);
    }
    QPDFNameTreeObjectHelper::iterator::operator--(&local_220);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_220);
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"000300","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,false);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"000305","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,true);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"000305","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,false);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"00000","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,false);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"00000","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,true);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"000800","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,false);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"000805","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,false);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  local_220._vptr_iterator =
       (_func_int **)
       &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"000805","");
  check_find((QPDFNameTreeObjectHelper *)local_1b0,(string *)&local_220,true);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_220._vptr_iterator !=
      &local_220.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_220._vptr_iterator,
                    CONCAT71(local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             local_220.impl.
                             super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) + 1);
  }
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_1b0);
  if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
  }
  QPDF::~QPDF((QPDF *)local_1d8);
  return;
}

Assistant:

void
test_depth()
{
    int constexpr NITEMS = 3;
    QPDF q;
    q.emptyPDF();
    auto root = q.getRoot();
    auto n0 = new_node(q, "/Kids");
    root.replaceKey("/NT", n0);
    auto k0 = root.getKey("/NT").getKey("/Kids");
    for (int i1 = 0; i1 < NITEMS; ++i1) {
        auto n1 = new_node(q, "/Kids");
        k0.appendItem(n1);
        auto k1 = n1.getKey("/Kids");
        for (int i2 = 0; i2 < NITEMS; ++i2) {
            auto n2 = new_node(q, "/Kids");
            k1.appendItem(n2);
            auto k2 = n2.getKey("/Kids");
            for (int i3 = 0; i3 < NITEMS; ++i3) {
                auto n3 = new_node(q, "/Names");
                k2.appendItem(n3);
                auto items = n3.getKey("/Names");
                std::string first;
                std::string last;
                for (int i4 = 0; i4 < NITEMS; ++i4) {
                    int val = (((((i1 * NITEMS) + i2) * NITEMS) + i3) * NITEMS) + i4;
                    std::string str = QUtil::int_to_string(10 * val, 6);
                    items.appendItem(QPDFObjectHandle::newString(str));
                    items.appendItem(QPDFObjectHandle::newString("val " + str));
                    if (i4 == 0) {
                        first = str;
                    } else if (i4 == NITEMS - 1) {
                        last = str;
                    }
                }
                auto limits = QPDFObjectHandle::newArray();
                n3.replaceKey("/Limits", limits);
                limits.appendItem(QPDFObjectHandle::newString(first));
                limits.appendItem(QPDFObjectHandle::newString(last));
            }
            auto limits = QPDFObjectHandle::newArray();
            n2.replaceKey("/Limits", limits);
            limits.appendItem(k2.getArrayItem(0).getKey("/Limits").getArrayItem(0));
            limits.appendItem(k2.getArrayItem(NITEMS - 1).getKey("/Limits").getArrayItem(1));
        }
        auto limits = QPDFObjectHandle::newArray();
        n1.replaceKey("/Limits", limits);
        limits.appendItem(k1.getArrayItem(0).getKey("/Limits").getArrayItem(0));
        limits.appendItem(k1.getArrayItem(NITEMS - 1).getKey("/Limits").getArrayItem(1));
    }

    QPDFNameTreeObjectHelper nh(n0, q);
    std::cout << "--- forward ---" << std::endl;
    for (auto i: nh) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- backward ---" << std::endl;
    for (auto i = nh.last(); i.valid(); --i) {
        std::cout << (*i).first << " -> " << (*i).second.unparse() << std::endl;
    }

    // Find
    check_find(nh, "000300", false);
    check_find(nh, "000305", true);
    check_find(nh, "000305", false);
    check_find(nh, "00000", false);
    check_find(nh, "00000", true);
    check_find(nh, "000800", false);
    check_find(nh, "000805", false);
    check_find(nh, "000805", true);
}